

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

void llvm::cl::
     apply<llvm::cl::opt<(anonymous_namespace)::HelpPrinter,true,llvm::cl::parser<bool>>,llvm::cl::desc,llvm::cl::LocationClass<(anonymous_namespace)::HelpPrinter>,llvm::cl::OptionHidden,llvm::cl::ValueExpected,llvm::cl::cat,llvm::cl::sub>
               (opt<(anonymous_namespace)::HelpPrinter,_true,_llvm::cl::parser<bool>_> *O,desc *M,
               LocationClass<(anonymous_namespace)::HelpPrinter> *Ms,OptionHidden *Ms_1,
               ValueExpected *Ms_2,cat *Ms_3,sub *Ms_4)

{
  cat *Ms_local_3;
  ValueExpected *Ms_local_2;
  OptionHidden *Ms_local_1;
  LocationClass<(anonymous_namespace)::HelpPrinter> *Ms_local;
  desc *M_local;
  opt<(anonymous_namespace)::HelpPrinter,_true,_llvm::cl::parser<bool>_> *O_local;
  
  applicator<llvm::cl::desc>::
  opt<llvm::cl::opt<(anonymous_namespace)::HelpPrinter,true,llvm::cl::parser<bool>>>(M,O);
  apply<llvm::cl::opt<(anonymous_namespace)::HelpPrinter,true,llvm::cl::parser<bool>>,llvm::cl::LocationClass<(anonymous_namespace)::HelpPrinter>,llvm::cl::OptionHidden,llvm::cl::ValueExpected,llvm::cl::cat,llvm::cl::sub>
            (O,Ms,Ms_1,Ms_2,Ms_3,Ms_4);
  return;
}

Assistant:

void apply(Opt *O, const Mod &M, const Mods &... Ms) {
  applicator<Mod>::opt(M, *O);
  apply(O, Ms...);
}